

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  ostringstream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar8;
  pointer pcVar9;
  double dVar10;
  undefined8 uVar11;
  int iVar12;
  float afVar13 [2];
  Interval *pIVar14;
  IVal *pIVar15;
  MessageBuilder *pMVar16;
  undefined8 *puVar17;
  uint uVar18;
  Matrix<float,_2,_4> *pMVar19;
  undefined1 *puVar20;
  long lVar21;
  FloatFormat *pFVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  float afVar26 [2];
  float afVar27 [2];
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
  *pBVar28;
  bool bVar29;
  IVal in2;
  IVal reference1;
  IVal in3;
  FuncSet funcs;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal in0;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa18;
  undefined4 uStack_5e4;
  size_type local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
  *local_5c8;
  IVal local_5b9;
  TestLog *local_5b8;
  size_t local_5b0;
  ulong local_5a8;
  TestStatus *local_5a0;
  Matrix<float,_2,_4> *local_598;
  FloatFormat *local_590;
  long local_588;
  string local_580;
  undefined1 local_560 [16];
  undefined1 local_550 [24];
  Vector<float,_2> local_538;
  Matrix<float,_2,_4> *local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
  local_468;
  FloatFormat local_438;
  undefined1 local_408 [24];
  Vector<float,_2> local_3f0;
  long local_3e8;
  void *local_3e0;
  long local_3d0;
  void *local_3c8;
  long local_3b8;
  void *local_3b0;
  long local_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  Interval IStack_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_368;
  undefined4 local_360;
  ios_base local_328 [8];
  ios_base local_320 [264];
  float local_218 [2];
  void *local_210;
  void *local_208;
  void *local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar22 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar5 = (this->m_caseCtx).numRandoms;
  local_5a0 = __return_storage_ptr__;
  iVar12 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            ((Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)(local_408 + 0x10),(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar22,(FloatFormat *)(ulong)PVar4,(Precision)sVar5,(ulong)(iVar12 + 0xdeadbeef),
             in_stack_fffffffffffffa18);
  uVar11 = local_408._16_8_;
  local_5b0 = (long)local_3f0.m_data - local_408._16_8_ >> 5;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_468,local_5b0);
  local_438.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_438.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_438.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_438.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_438.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_438.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_438.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_438.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_438._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_5b8 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218[0] = (float)local_408._16_4_;
  local_218[1] = (float)local_408._20_4_;
  local_210 = local_3e0;
  local_208 = local_3c8;
  local_200 = local_3b0;
  local_408._0_8_ =
       local_468.out0.
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_408._8_8_ =
       local_468.out1.
       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
       _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_398 + 8);
  local_5c8 = this;
  local_398._0_8_ = local_5b8;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  afVar27 = (float  [2])((long)local_560 + 8);
  local_560._8_4_ = _S_red;
  local_550._0_4_ = 0.0;
  local_550._4_4_ = 0.0;
  local_538.m_data[0] = 0.0;
  local_538.m_data[1] = 0.0;
  pSVar6 = (local_5c8->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_590 = pFVar22;
  local_550._8_8_ = afVar27;
  local_550._16_8_ = afVar27;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_560);
  if ((float  [2])local_550._8_8_ != afVar27) {
    afVar13 = (float  [2])local_550._8_8_;
    do {
      (**(code **)(**(long **)((long)afVar13 + 0x20) + 0x30))
                (*(long **)((long)afVar13 + 0x20),local_1a8);
      afVar13 = (float  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)afVar13);
    } while (afVar13 != afVar27);
  }
  pFVar22 = local_590;
  if (local_538.m_data != (float  [2])0x0) {
    poVar3 = (ostringstream *)(local_398 + 8);
    local_398._0_8_ = local_5b8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),local_5e0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18) != &local_5d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),
                      local_5d8._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_320);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_560);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pBVar28 = local_5c8;
  pSVar7 = (local_5c8->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pMVar19 = (Matrix<float,_2,_4> *)local_408;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,local_5b0,local_218,pMVar19,0);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_398);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_560);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_498,
             (pBVar28->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_398);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_498,
             (pBVar28->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar28->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa18);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar28->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_580);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_498,
             (pBVar28->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.m_ptr,
             (IVal *)local_560);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar28->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_5b9);
  if (local_3f0.m_data == (float  [2])uVar11) {
    local_5a8 = 0;
  }
  else {
    local_4a0 = (Matrix<float,_2,_4> *)(local_5b0 + (local_5b0 == 0));
    local_598 = (Matrix<float,_2,_4> *)0x0;
    local_5a8 = 0;
    do {
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
      local_588 = (long)local_598 * 0x20;
      round<tcu::Matrix<float,2,4>>
                ((IVal *)local_560,(shaderexecutor *)pFVar22,
                 (FloatFormat *)(local_408._16_8_ + local_588),pMVar19);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_398,pFVar22,(IVal *)local_560);
      pIVar14 = (Interval *)
                Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_498,
                           (pBVar28->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      pMVar16 = (MessageBuilder *)local_398;
      lVar21 = 0;
      do {
        lVar23 = 0;
        do {
          *(undefined8 *)((long)&pIVar14->m_hi + lVar23) =
               *(undefined8 *)(&pMVar16->field_0x10 + lVar23);
          puVar17 = (undefined8 *)((long)&pMVar16->m_log + lVar23);
          dVar10 = (double)puVar17[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)&pIVar14->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar23;
          *(undefined8 *)pbVar2 = *puVar17;
          *(double *)(pbVar2 + 8) = dVar10;
          lVar23 = lVar23 + 0x30;
        } while (lVar23 != 0xc0);
        pIVar14 = pIVar14 + 1;
        pMVar16 = (MessageBuilder *)&pMVar16->field_0x18;
        bVar29 = lVar21 == 0;
        lVar21 = lVar21 + 1;
      } while (bVar29);
      round<tcu::Matrix<float,2,4>>
                ((IVal *)local_560,(shaderexecutor *)pFVar22,
                 (FloatFormat *)((long)local_3e0 + local_588),(Matrix<float,_2,_4> *)pMVar16);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_398,pFVar22,(IVal *)local_560);
      pIVar14 = (Interval *)
                Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_498,
                           (pBVar28->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      lVar21 = local_588;
      pMVar16 = (MessageBuilder *)local_398;
      lVar23 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&pIVar14->m_hi + lVar24) =
               *(undefined8 *)(&pMVar16->field_0x10 + lVar24);
          puVar17 = (undefined8 *)((long)&pMVar16->m_log + lVar24);
          dVar10 = (double)puVar17[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)&pIVar14->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          *(undefined8 *)pbVar2 = *puVar17;
          *(double *)(pbVar2 + 8) = dVar10;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0xc0);
        pIVar14 = pIVar14 + 1;
        pMVar16 = (MessageBuilder *)&pMVar16->field_0x18;
        bVar29 = lVar23 == 0;
        lVar23 = lVar23 + 1;
      } while (bVar29);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar28->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar28->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      IStack_380.m_hi._0_4_ = (pBVar28->m_caseCtx).precision;
      IStack_380.m_lo = pFVar22->m_maxValue;
      local_398._0_8_ = *(undefined8 *)pFVar22;
      local_398._8_4_ = pFVar22->m_fractionBits;
      local_398._12_4_ = pFVar22->m_hasSubnormal;
      local_388._0_4_ = pFVar22->m_hasInf;
      local_388._4_4_ = pFVar22->m_hasNaN;
      IStack_380.m_hasNaN = pFVar22->m_exactPrecision;
      IStack_380._1_3_ = *(undefined3 *)&pFVar22->field_0x19;
      IStack_380._4_4_ = *(undefined4 *)&pFVar22->field_0x1c;
      local_360 = 0;
      pSVar6 = (pBVar28->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_368 = &local_498;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(MessageBuilder *)local_398);
      pIVar15 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_498,
                           (pBVar28->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_398,&local_438,pIVar15);
      puVar20 = local_1a8;
      pMVar16 = (MessageBuilder *)local_398;
      lVar23 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)(puVar20 + lVar24 + 0x10) = *(undefined8 *)(&pMVar16->field_0x10 + lVar24);
          puVar17 = (undefined8 *)((long)&pMVar16->m_log + lVar24);
          uVar11 = puVar17[1];
          *(undefined8 *)(puVar20 + lVar24) = *puVar17;
          *(undefined8 *)((long)(puVar20 + lVar24) + 8) = uVar11;
          lVar24 = lVar24 + 0x30;
        } while (lVar24 != 0xc0);
        puVar20 = puVar20 + 0x18;
        pMVar16 = (MessageBuilder *)&pMVar16->field_0x18;
        bVar29 = lVar23 == 0;
        lVar23 = lVar23 + 1;
      } while (bVar29);
      poVar3 = (ostringstream *)(local_398 + 8);
      bVar29 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_1a8,
                          (Matrix<float,_2,_4> *)
                          ((long)local_468.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar21));
      local_398._0_8_ = local_388;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_398,"Shader output 0 is outside acceptable range","");
      bVar29 = tcu::ResultCollector::check(&local_1f8,bVar29,(string *)local_398);
      if ((TestLog *)local_398._0_8_ != (TestLog *)local_388) {
        operator_delete((void *)local_398._0_8_,CONCAT44(local_388._4_4_,local_388._0_4_) + 1);
      }
      uVar18 = (int)local_5a8 + ((byte)~bVar29 & 1);
      local_5a8 = (ulong)uVar18;
      if ((int)uVar18 < 0x65 && !bVar29) {
        local_398._0_8_ = local_5b8;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar25 = "Failed";
        if (bVar29) {
          pcVar25 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar25,6);
        pFVar22 = local_590;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar8 = (local_5c8->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                 m_ptr;
        pMVar19 = (Matrix<float,_2,_4> *)local_550;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_560._0_8_ = pMVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_560._0_8_,
                   CONCAT44(local_560._12_4_,local_560._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,4>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)&local_438,
                   (FloatFormat *)(local_408._16_8_ + lVar21),pMVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),
                   local_5e0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18) != &local_5d8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),
                          local_5d8._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_4> *)local_560._0_8_ != (Matrix<float,_2,_4> *)local_550) {
          operator_delete((void *)local_560._0_8_,(ulong)(local_550._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar8 = (local_5c8->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                 m_ptr;
        pMVar19 = (Matrix<float,_2,_4> *)local_550;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_560._0_8_ = pMVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_560._0_8_,
                   CONCAT44(local_560._12_4_,local_560._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,4>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)&local_438,
                   (FloatFormat *)((long)local_3e0 + lVar21),pMVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),
                   local_5e0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18) != &local_5d8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),
                          local_5d8._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_2,_4> *)local_560._0_8_ != (Matrix<float,_2,_4> *)local_550) {
          operator_delete((void *)local_560._0_8_,(ulong)(local_550._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar8 = (local_5c8->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                 m_ptr;
        pIVar15 = (IVal *)local_550;
        pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
        local_560._0_8_ = pIVar15;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_560,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_560._0_8_,
                   CONCAT44(local_560._12_4_,local_560._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,4>>
                  ((string *)&stack0xfffffffffffffa18,(shaderexecutor *)&local_438,
                   (FloatFormat *)
                   (lVar21 + (long)local_468.out0.
                                   super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start),
                   (Matrix<float,_2,_4> *)pIVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),
                   local_5e0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,4>>
                  (&local_580,(shaderexecutor *)&local_438,(FloatFormat *)local_1a8,pIVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_580._M_dataplus._M_p,local_580._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18) != &local_5d8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_5e4,in_stack_fffffffffffffa18),
                          local_5d8._M_allocated_capacity + 1);
        }
        if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
          operator_delete((void *)local_560._0_8_,(ulong)(local_550._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_320);
      }
      pMVar19 = (Matrix<float,_2,_4> *)((long)(local_598->m_data).m_data[0].m_data + 1);
      pBVar28 = local_5c8;
      local_598 = pMVar19;
    } while (pMVar19 != local_4a0);
  }
  iVar12 = (int)local_5a8;
  if (100 < iVar12) {
    poVar3 = (ostringstream *)(local_398 + 8);
    local_398._0_8_ = local_5b8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar12 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_320);
  }
  poVar3 = (ostringstream *)(local_398 + 8);
  if (iVar12 == 0) {
    local_398._0_8_ = local_5b8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_398._0_8_ = local_5b8;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_320);
  if (iVar12 == 0) {
    local_398._0_8_ = (IVal *)local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Pass","");
    local_5a0->m_code = QP_TEST_RESULT_PASS;
    (local_5a0->m_description)._M_dataplus._M_p = (pointer)&(local_5a0->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a0->m_description,local_398._0_8_,
               (long)&((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)local_398._0_8_)->m_data[0].
                      m_data[0].m_hasNaN + CONCAT44(local_398._12_4_,local_398._8_4_));
    if ((IVal *)local_398._0_8_ == (IVal *)local_388) goto LAB_00929c8f;
    afVar27[1] = (float)local_388._4_4_;
    afVar27[0] = (float)local_388._0_4_;
    pIVar15 = (IVal *)local_398._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
    std::ostream::operator<<(local_398,iVar12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    std::ios_base::~ios_base(local_328);
    local_398._0_8_ = (IVal *)local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398," test failed. Check log for the details","");
    afVar27 = (float  [2])
              (CONCAT44(local_398._12_4_,local_398._8_4_) +
              CONCAT44(local_560._12_4_,local_560._8_4_));
    afVar13[0] = 2.10195e-44;
    afVar13[1] = 0.0;
    if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
      afVar13 = (float  [2])local_550._0_8_;
    }
    if ((ulong)afVar13 < (ulong)afVar27) {
      afVar26[0] = 2.10195e-44;
      afVar26[1] = 0.0;
      if ((IVal *)local_398._0_8_ != (IVal *)local_388) {
        afVar26[1] = (float)local_388._4_4_;
        afVar26[0] = (float)local_388._0_4_;
      }
      if ((ulong)afVar26 < (ulong)afVar27) goto LAB_00929b13;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_398,0,(char *)0x0,local_560._0_8_);
    }
    else {
LAB_00929b13:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_560,local_398._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar17 + 2);
    if ((double *)*puVar17 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar17 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar17 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar17;
    }
    local_1a8._8_8_ = puVar17[1];
    *puVar17 = pdVar1;
    puVar17[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_5a0->m_code = QP_TEST_RESULT_FAIL;
    (local_5a0->m_description)._M_dataplus._M_p = (pointer)&(local_5a0->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a0->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((IVal *)local_398._0_8_ != (IVal *)local_388) {
      operator_delete((void *)local_398._0_8_,CONCAT44(local_388._4_4_,local_388._0_4_) + 1);
    }
    afVar27 = (float  [2])local_550._0_8_;
    pIVar15 = (IVal *)local_560._0_8_;
    if ((IVal *)local_560._0_8_ == (IVal *)local_550) goto LAB_00929c8f;
  }
  operator_delete(pIVar15,(ulong)((long)afVar27 + 1));
LAB_00929c8f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if ((float  [2])
      local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (float  [2])0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((float  [2])
      local_468.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (float  [2])0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3b0 != (void *)0x0) {
    operator_delete(local_3b0,local_3a0 - (long)local_3b0);
  }
  if (local_3c8 != (void *)0x0) {
    operator_delete(local_3c8,local_3b8 - (long)local_3c8);
  }
  if (local_3e0 != (void *)0x0) {
    operator_delete(local_3e0,local_3d0 - (long)local_3e0);
  }
  if ((float  [2])local_408._16_8_ != (float  [2])0x0) {
    operator_delete((void *)local_408._16_8_,local_3e8 - local_408._16_8_);
  }
  return local_5a0;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}